

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

RECEIVED_HANDLE received_create(uint32_t section_number_value,uint64_t section_offset_value)

{
  int iVar1;
  RECEIVED_INSTANCE_TAG RVar2;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  int local_34;
  int result;
  AMQP_VALUE section_offset_amqp_value;
  AMQP_VALUE section_number_amqp_value;
  RECEIVED_INSTANCE *received_instance;
  uint64_t section_offset_value_local;
  uint32_t section_number_value_local;
  
  section_number_amqp_value = (AMQP_VALUE)malloc(8);
  if (section_number_amqp_value != (AMQP_VALUE)0x0) {
    RVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x23);
    *(AMQP_VALUE *)section_number_amqp_value = RVar2.composite_value;
    if (*(AMQP_VALUE *)section_number_amqp_value == (AMQP_VALUE)0x0) {
      free(section_number_amqp_value);
      section_number_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_34 = 0;
      item_value = amqpvalue_create_uint(section_number_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)section_number_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_34 = 0x42f9;
      }
      item_value_00 = amqpvalue_create_ulong(section_offset_value);
      if ((local_34 == 0) &&
         (iVar1 = amqpvalue_set_composite_item
                            (*(AMQP_VALUE *)section_number_amqp_value,1,item_value_00), iVar1 != 0))
      {
        local_34 = 0x42fe;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      if (local_34 != 0) {
        received_destroy((RECEIVED_HANDLE)section_number_amqp_value);
        section_number_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (RECEIVED_HANDLE)section_number_amqp_value;
}

Assistant:

RECEIVED_HANDLE received_create(uint32_t section_number_value, uint64_t section_offset_value)
{
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)malloc(sizeof(RECEIVED_INSTANCE));
    if (received_instance != NULL)
    {
        received_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(35);
        if (received_instance->composite_value == NULL)
        {
            free(received_instance);
            received_instance = NULL;
        }
        else
        {
            AMQP_VALUE section_number_amqp_value;
            AMQP_VALUE section_offset_amqp_value;
            int result = 0;

            section_number_amqp_value = amqpvalue_create_uint(section_number_value);
            if ((result == 0) && (amqpvalue_set_composite_item(received_instance->composite_value, 0, section_number_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            section_offset_amqp_value = amqpvalue_create_ulong(section_offset_value);
            if ((result == 0) && (amqpvalue_set_composite_item(received_instance->composite_value, 1, section_offset_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(section_number_amqp_value);
            amqpvalue_destroy(section_offset_amqp_value);
            if (result != 0)
            {
                received_destroy(received_instance);
                received_instance = NULL;
            }
        }
    }

    return received_instance;
}